

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *pcVar1;
  cJSON *after_inserted;
  cJSON *newitem_local;
  int which_local;
  cJSON *array_local;
  
  if (-1 < which) {
    pcVar1 = get_array_item(array,(long)which);
    if (pcVar1 == (cJSON *)0x0) {
      add_item_to_array(array,newitem);
    }
    else {
      newitem->next = pcVar1;
      newitem->prev = pcVar1->prev;
      pcVar1->prev = newitem;
      if (pcVar1 == array->child) {
        array->child = newitem;
      }
      else {
        newitem->prev->next = newitem;
      }
    }
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0)
    {
        return;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        add_item_to_array(array, newitem);
        return;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
}